

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

bstring bread(bNread readPtr,void *parm)

{
  int iVar1;
  bstring buff;
  int ret;
  void *parm_local;
  bNread readPtr_local;
  
  if (readPtr == (bNread)0x0) {
    readPtr_local = (bNread)0x0;
  }
  else {
    readPtr_local = (bNread)bfromcstr("");
    if ((bstring)readPtr_local == (bstring)0x0) {
      readPtr_local = (bNread)0x0;
    }
    else {
      iVar1 = breada((bstring)readPtr_local,readPtr,parm);
      if (iVar1 < 0) {
        bdestroy((bstring)readPtr_local);
        readPtr_local = (bNread)0x0;
      }
    }
  }
  return (bstring)readPtr_local;
}

Assistant:

bstring bread (bNread readPtr, void * parm) {
int ret;
bstring buff;

	if (readPtr == NULL) return NULL;
	buff = bfromcstr ("");
	if (buff == NULL) return NULL;
	ret = breada (buff, readPtr, parm);
	if (ret < 0) {
		bdestroy (buff);
		return NULL;
	}
	return buff;
}